

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form4_BitwiseOr(BitwiseOrForm4 BitwiseOr)

{
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  initializer_list<PenguinV_Image::ImageTemplate<unsigned_char>_> __l;
  byte bVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  code *in_RDI;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined8 in_stack_fffffffffffffd08;
  uint8_t in_stack_fffffffffffffd16;
  uint8_t in_stack_fffffffffffffd17;
  uint32_t in_stack_fffffffffffffd18;
  uint32_t in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  uint32_t in_stack_fffffffffffffd34;
  uint32_t in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd48 [15];
  uint8_t in_stack_fffffffffffffd57;
  uint32_t in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd5c;
  Image *image_00;
  uint32_t *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined2 in_stack_fffffffffffffd8c;
  undefined1 in_stack_fffffffffffffd8e;
  undefined1 in_stack_fffffffffffffd8f;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_stack_fffffffffffffd90;
  size_type sVar11;
  undefined1 **local_1f0;
  undefined4 local_1b0;
  undefined4 local_1ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_190;
  undefined1 local_171;
  undefined8 *local_e8;
  undefined1 *local_e0 [5];
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  undefined8 *local_68;
  undefined8 local_60;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  code *local_28;
  
  local_28 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  local_171 = 1;
  local_e8 = local_e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_stack_fffffffffffffd1c
             ,in_stack_fffffffffffffd18,in_stack_fffffffffffffd17,in_stack_fffffffffffffd16);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd3c >> 0x18),in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd34,
             (Image *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_e8 = (undefined8 *)local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_stack_fffffffffffffd1c
             ,in_stack_fffffffffffffd18,in_stack_fffffffffffffd17,in_stack_fffffffffffffd16);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd3c >> 0x18),in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd34,
             (Image *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_e8 = (undefined8 *)local_90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_40,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),in_stack_fffffffffffffd1c
             ,in_stack_fffffffffffffd18,in_stack_fffffffffffffd17,in_stack_fffffffffffffd16);
  Test_Helper::uniformImage
            ((uint8_t)((uint)in_stack_fffffffffffffd3c >> 0x18),in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd34,
             (Image *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_171 = 0;
  local_68 = local_e0;
  local_60 = 3;
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cf88f);
  __l._M_len._7_1_ = in_stack_fffffffffffffd57;
  __l._0_15_ = in_stack_fffffffffffffd48;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::vector(in_stack_fffffffffffffd40,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>::~allocator
            ((allocator<PenguinV_Image::ImageTemplate<unsigned_char>_> *)0x1cf8c3);
  local_1f0 = (undefined1 **)&local_68;
  do {
    local_1f0 = local_1f0 + -5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1cf8f8);
  } while (local_1f0 != local_e0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf922);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf92f);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1cf93c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cf951);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1cf966);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffd90,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffd8f,
                      CONCAT16(in_stack_fffffffffffffd8e,
                               CONCAT24(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88))),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (uint32_t *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
             in_stack_fffffffffffffd70);
  sVar11 = 0;
  pvVar7 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_58,0);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_190,sVar11);
  vVar1 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1a8,sVar11);
  vVar2 = *pvVar8;
  pvVar9 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](&local_58,1);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_190,1);
  vVar3 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1a8,1);
  vVar4 = *pvVar8;
  pvVar10 = std::
            vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ::operator[](&local_58,2);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_190,2);
  vVar5 = *pvVar8;
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1a8,2);
  (*local_28)(pvVar7,vVar1,vVar2,pvVar9,vVar3,vVar4,pvVar10,vVar5,*pvVar8,local_1ac,local_1b0);
  sVar11 = 2;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_58,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_190,sVar11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_1a8,sVar11);
  image_00 = (Image *)&local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image_00,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image_00,1);
  bVar6 = Unit_Test::verifyImage
                    (image_00,(uint32_t)(sVar11 >> 0x20),(uint32_t)sVar11,in_stack_fffffffffffffd5c,
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd57);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd24,local_1ac));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffd24,local_1ac));
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)CONCAT44(in_stack_fffffffffffffd24,local_1ac));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffd24,local_1ac));
  return (bool)(bVar6 & 1);
}

Assistant:

bool form4_BitwiseOr(BitwiseOrForm4 BitwiseOr)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        std::vector < PenguinV_Image::Image > image = { uniformImage( intensity[0] ), uniformImage( intensity[1] ), uniformImage( intensity[2] ) };

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( image, roiX, roiY, roiWidth, roiHeight );

        BitwiseOr( image[0], roiX[0], roiY[0], image[1], roiX[1], roiY[1], image[2], roiX[2], roiY[2], roiWidth, roiHeight );

        return verifyImage( image[2], roiX[2], roiY[2], roiWidth, roiHeight, intensity[0] | intensity[1] );
    }